

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Matrix * MatrixAddition(Matrix *a,Matrix *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Matrix *pMVar3;
  long lVar4;
  
  if ((a->rows == b->rows) && (a->columns == b->columns)) {
    pMVar3 = MatrixClone(a);
    uVar1 = pMVar3->columns;
    uVar2 = pMVar3->rows;
    for (lVar4 = 0; (ulong)(uVar1 * uVar2) << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      *(longdouble *)((long)pMVar3->matrix + lVar4) =
           *(longdouble *)((long)pMVar3->matrix + lVar4) + *(longdouble *)((long)b->matrix + lVar4);
    }
  }
  else {
    pMVar3 = (Matrix *)0x0;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixAddition");
  }
  return pMVar3;
}

Assistant:

Matrix *MatrixAddition(const Matrix *a, const Matrix *b) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return NULL;
  }
#endif
  Matrix *new = MatrixClone(a);
  for (uint64_t index = 0; index < new->rows * new->columns; ++index) {
    new->matrix[index] += b->matrix[index];
  }
  return new;
}